

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthRangeTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::DepthRangeTests::init(DepthRangeTests *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  TestNode *pTVar2;
  DepthRangeWriteCase *this_00;
  undefined8 extraout_RAX;
  undefined8 uVar3;
  DepthRangeCompareCase *this_01;
  undefined8 extraout_RAX_00;
  long lVar4;
  
  if (init()::cases == '\0') {
    iVar1 = __cxa_guard_acquire(&init()::cases);
    if (iVar1 != 0) {
      init::cases[0].name = "default";
      init::cases[0].desc = "Default depth range";
      init::cases[0].depthCoord.m_data[0] = _DAT_0181a7b0;
      init::cases[0].depthCoord.m_data[1] = _UNK_0181a7b4;
      init::cases[0].depthCoord.m_data[2] = _UNK_0181a7b8;
      init::cases[0].depthCoord.m_data[3] = _UNK_0181a7bc;
      init::cases[0].zNear = 0.0;
      init::cases[0].zFar = 1.0;
      init::cases[1].name = "reverse";
      init::cases[1].desc = "Reversed default range";
      init::cases[1].depthCoord.m_data[0] = _DAT_0181a7b0;
      init::cases[1].depthCoord.m_data[1] = _UNK_0181a7b4;
      init::cases[1].depthCoord.m_data[2] = _UNK_0181a7b8;
      init::cases[1].depthCoord.m_data[3] = _UNK_0181a7bc;
      init::cases[1].zNear = 1.0;
      init::cases[1].zFar = 0.0;
      init::cases[2].name = "zero_to_half";
      init::cases[2].desc = "From 0 to 0.5";
      init::cases[2].depthCoord.m_data[0] = _DAT_0181a7b0;
      init::cases[2].depthCoord.m_data[1] = _UNK_0181a7b4;
      init::cases[2].depthCoord.m_data[2] = _UNK_0181a7b8;
      init::cases[2].depthCoord.m_data[3] = _UNK_0181a7bc;
      init::cases[2].zNear = 0.0;
      init::cases[2].zFar = 0.5;
      init::cases[3].name = "half_to_one";
      init::cases[3].desc = "From 0.5 to 1";
      init::cases[3].depthCoord.m_data[0] = _DAT_0181a7b0;
      init::cases[3].depthCoord.m_data[1] = _UNK_0181a7b4;
      init::cases[3].depthCoord.m_data[2] = _UNK_0181a7b8;
      init::cases[3].depthCoord.m_data[3] = _UNK_0181a7bc;
      init::cases[3].zNear = 0.5;
      init::cases[3].zFar = 1.0;
      init::cases[4].name = "half_to_zero";
      init::cases[4].desc = "From 0.5 to 0";
      init::cases[4].depthCoord.m_data[0] = _DAT_0181a7b0;
      init::cases[4].depthCoord.m_data[1] = _UNK_0181a7b4;
      init::cases[4].depthCoord.m_data[2] = _UNK_0181a7b8;
      init::cases[4].depthCoord.m_data[3] = _UNK_0181a7bc;
      init::cases[4].zNear = 0.5;
      init::cases[4].zFar = 0.0;
      init::cases[5].name = "one_to_half";
      init::cases[5].desc = "From 1 to 0.5";
      init::cases[5].depthCoord.m_data[0] = _DAT_0181a7b0;
      init::cases[5].depthCoord.m_data[1] = _UNK_0181a7b4;
      init::cases[5].depthCoord.m_data[2] = _UNK_0181a7b8;
      init::cases[5].depthCoord.m_data[3] = _UNK_0181a7bc;
      init::cases[5].zNear = 1.0;
      init::cases[5].zFar = 0.5;
      init::cases[6].name = "third_to_0_8";
      init::cases[6].desc = "From 1/3 to 0.8";
      init::cases[6].depthCoord.m_data[0] = _DAT_0181a7b0;
      init::cases[6].depthCoord.m_data[1] = _UNK_0181a7b4;
      init::cases[6].depthCoord.m_data[2] = _UNK_0181a7b8;
      init::cases[6].depthCoord.m_data[3] = _UNK_0181a7bc;
      init::cases[6].zNear = 0.33333334;
      init::cases[6].zFar = 0.8;
      init::cases[7].name = "0_8_to_third";
      init::cases[7].desc = "From 0.8 to 1/3";
      init::cases[7].depthCoord.m_data[0] = _DAT_0181a7b0;
      init::cases[7].depthCoord.m_data[1] = _UNK_0181a7b4;
      init::cases[7].depthCoord.m_data[2] = _UNK_0181a7b8;
      init::cases[7].depthCoord.m_data[3] = _UNK_0181a7bc;
      init::cases[7].zNear = 0.8;
      init::cases[7].zFar = 0.33333334;
      init::cases[8].name = "zero_to_zero";
      init::cases[8].desc = "From 0 to 0";
      init::cases[8].depthCoord.m_data[0] = _DAT_0181a7b0;
      init::cases[8].depthCoord.m_data[1] = _UNK_0181a7b4;
      init::cases[8].depthCoord.m_data[2] = _UNK_0181a7b8;
      init::cases[8].depthCoord.m_data[3] = _UNK_0181a7bc;
      init::cases[8].zNear = 0.0;
      init::cases[8].zFar = 0.0;
      init::cases[9].name = "half_to_half";
      init::cases[9].desc = "From 0.5 to 0.5";
      init::cases[9].depthCoord.m_data[0] = _DAT_0181a7b0;
      init::cases[9].depthCoord.m_data[1] = _UNK_0181a7b4;
      init::cases[9].depthCoord.m_data[2] = _UNK_0181a7b8;
      init::cases[9].depthCoord.m_data[3] = _UNK_0181a7bc;
      init::cases[9]._32_8_ = &DAT_3f0000003f000000;
      init::cases[10].name = "one_to_one";
      init::cases[10].desc = "From 1 to 1";
      init::cases[10].depthCoord.m_data[0] = _DAT_0181a7b0;
      init::cases[10].depthCoord.m_data[1] = _UNK_0181a7b4;
      init::cases[10].depthCoord.m_data[2] = _UNK_0181a7b8;
      init::cases[10].depthCoord.m_data[3] = _UNK_0181a7bc;
      init::cases[10].zNear = 1.0;
      init::cases[10].zFar = 1.0;
      init::cases[0xb].name = "clamp_near";
      init::cases[0xb].desc = "From -1 to 1";
      init::cases[0xb].depthCoord.m_data[0] = _DAT_0181a7b0;
      init::cases[0xb].depthCoord.m_data[1] = _UNK_0181a7b4;
      init::cases[0xb].depthCoord.m_data[2] = _UNK_0181a7b8;
      init::cases[0xb].depthCoord.m_data[3] = _UNK_0181a7bc;
      init::cases[0xb].zNear = -1.0;
      init::cases[0xb].zFar = 1.0;
      init::cases[0xc].name = "clamp_far";
      init::cases[0xc].desc = "From 0 to 2";
      init::cases[0xc].depthCoord.m_data[0] = _DAT_0181a7b0;
      init::cases[0xc].depthCoord.m_data[1] = _UNK_0181a7b4;
      init::cases[0xc].depthCoord.m_data[2] = _UNK_0181a7b8;
      init::cases[0xc].depthCoord.m_data[3] = _UNK_0181a7bc;
      init::cases[0xc].zNear = 0.0;
      init::cases[0xc].zFar = 2.0;
      init::cases[0xd].name = "clamp_both";
      init::cases[0xd].desc = "From -1 to 2";
      init::cases[0xd].depthCoord.m_data[0] = _DAT_0181a7b0;
      init::cases[0xd].depthCoord.m_data[1] = _UNK_0181a7b4;
      init::cases[0xd].depthCoord.m_data[2] = _UNK_0181a7b8;
      init::cases[0xd].depthCoord.m_data[3] = _UNK_0181a7bc;
      init::cases[0xd].zNear = -1.0;
      init::cases[0xd].zFar = 2.0;
      __cxa_guard_release(&init()::cases);
    }
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"write",
             "gl_FragDepth write tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  for (lVar4 = 0; lVar4 != 0x230; lVar4 = lVar4 + 0x28) {
    this_00 = (DepthRangeWriteCase *)operator_new(0x88);
    DepthRangeWriteCase::DepthRangeWriteCase
              (this_00,(this->super_TestCaseGroup).m_context,
               *(char **)((long)&((anon_struct_40_5_8aa28cec *)(&init::cases[0].depthCoord + -1))->
                                 name + lVar4),
               *(char **)((long)init::cases[0].depthCoord.m_data + lVar4 + -8),
               (Vec4 *)((long)init::cases[0].depthCoord.m_data + lVar4),
               *(float *)((long)(&init::cases[0].depthCoord + 1) + lVar4),
               *(float *)((long)(&init::cases[0].depthCoord + 1) + lVar4 + 4));
    tcu::TestNode::addChild(pTVar2,(TestNode *)this_00);
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"compare",
             "gl_FragDepth used with depth comparison");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  uVar3 = extraout_RAX;
  for (lVar4 = 0; lVar4 != 0x230; lVar4 = lVar4 + 0x28) {
    this_01 = (DepthRangeCompareCase *)operator_new(0x98);
    DepthRangeCompareCase::DepthRangeCompareCase
              (this_01,(this->super_TestCaseGroup).m_context,
               *(char **)((long)&((anon_struct_40_5_8aa28cec *)(&init::cases[0].depthCoord + -1))->
                                 name + lVar4),
               *(char **)((long)init::cases[0].depthCoord.m_data + lVar4 + -8),
               (Vec4 *)((long)init::cases[0].depthCoord.m_data + lVar4),
               *(float *)((long)(&init::cases[0].depthCoord + 1) + lVar4),
               *(float *)((long)(&init::cases[0].depthCoord + 1) + lVar4 + 4),0x201);
    tcu::TestNode::addChild(pTVar2,(TestNode *)this_01);
    uVar3 = extraout_RAX_00;
  }
  return (int)uVar3;
}

Assistant:

void DepthRangeTests::init (void)
{
	static const struct
	{
		const char*			name;
		const char*			desc;
		const tcu::Vec4		depthCoord;
		const float			zNear;
		const float			zFar;
	} cases[] =
	{
		{ "default",		"Default depth range",		tcu::Vec4(-1.0f, 0.2f, -0.3f, 1.0f),	0.0f,		1.0f },
		{ "reverse",		"Reversed default range",	tcu::Vec4(-1.0f, 0.2f, -0.3f, 1.0f),	1.0f,		0.0f },
		{ "zero_to_half",	"From 0 to 0.5",			tcu::Vec4(-1.0f, 0.2f, -0.3f, 1.0f),	0.0f,		0.5f },
		{ "half_to_one",	"From 0.5 to 1",			tcu::Vec4(-1.0f, 0.2f, -0.3f, 1.0f),	0.5f,		1.0f },
		{ "half_to_zero",	"From 0.5 to 0",			tcu::Vec4(-1.0f, 0.2f, -0.3f, 1.0f),	0.5f,		0.0f },
		{ "one_to_half",	"From 1 to 0.5",			tcu::Vec4(-1.0f, 0.2f, -0.3f, 1.0f),	1.0f,		0.5f },
		{ "third_to_0_8",	"From 1/3 to 0.8",			tcu::Vec4(-1.0f, 0.2f, -0.3f, 1.0f),	1.0f/3.0f,	0.8f },
		{ "0_8_to_third",	"From 0.8 to 1/3",			tcu::Vec4(-1.0f, 0.2f, -0.3f, 1.0f),	0.8f,		1.0f/3.0f },
		{ "zero_to_zero",	"From 0 to 0",				tcu::Vec4(-1.0f, 0.2f, -0.3f, 1.0f),	0.0f,		0.0f },
		{ "half_to_half",	"From 0.5 to 0.5",			tcu::Vec4(-1.0f, 0.2f, -0.3f, 1.0f),	0.5f,		0.5f },
		{ "one_to_one",		"From 1 to 1",				tcu::Vec4(-1.0f, 0.2f, -0.3f, 1.0f),	1.0f,		1.0f },
		{ "clamp_near",		"From -1 to 1",				tcu::Vec4(-1.0f, 0.2f, -0.3f, 1.0f),	-1.0f,		1.0f },
		{ "clamp_far",		"From 0 to 2",				tcu::Vec4(-1.0f, 0.2f, -0.3f, 1.0f),	0.0f,		2.0 },
		{ "clamp_both",		"From -1 to 2",				tcu::Vec4(-1.0f, 0.2f, -0.3f, 1.0f),	-1.0,		2.0 }
	};

	// .write
	tcu::TestCaseGroup* writeGroup = new tcu::TestCaseGroup(m_testCtx, "write", "gl_FragDepth write tests");
	addChild(writeGroup);
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(cases); ndx++)
		writeGroup->addChild(new DepthRangeWriteCase(m_context, cases[ndx].name, cases[ndx].desc, cases[ndx].depthCoord, cases[ndx].zNear, cases[ndx].zFar));

	// .compare
	tcu::TestCaseGroup* compareGroup = new tcu::TestCaseGroup(m_testCtx, "compare", "gl_FragDepth used with depth comparison");
	addChild(compareGroup);
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(cases); ndx++)
		compareGroup->addChild(new DepthRangeCompareCase(m_context, cases[ndx].name, cases[ndx].desc, cases[ndx].depthCoord, cases[ndx].zNear, cases[ndx].zFar, GL_LESS));
}